

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaCom.c
# Opt level: O3

void Pla_AbcFreeMan(Abc_Frame_t *pAbc)

{
  int iVar1;
  FILE *__ptr;
  void *pvVar2;
  long lVar3;
  long lVar4;
  
  if (pAbc == (Abc_Frame_t *)0x0) {
    return;
  }
  if (pAbc->pNtkCur != (Abc_Ntk_t *)0x0) {
    free(pAbc->pNtkCur);
    pAbc->pNtkCur = (Abc_Ntk_t *)0x0;
  }
  pAbc->aHistory = (Vec_Ptr_t *)0x0;
  if (pAbc->pNtkBestArea != (Abc_Ntk_t *)0x0) {
    free(pAbc->pNtkBestArea);
    pAbc->pNtkBestArea = (Abc_Ntk_t *)0x0;
  }
  pAbc->pNtkBestDelay = (Abc_Ntk_t *)0x0;
  if (*(void **)&pAbc->nSteps != (void *)0x0) {
    free(*(void **)&pAbc->nSteps);
    pAbc->nSteps = 0;
    pAbc->fSource = 0;
  }
  pAbc->pNtkBackup = (Abc_Ntk_t *)0x0;
  if (*(void **)&pAbc->fBridgeMode != (void *)0x0) {
    free(*(void **)&pAbc->fBridgeMode);
    *(undefined8 *)&pAbc->fBridgeMode = 0;
  }
  pAbc->fAutoexac = 0;
  pAbc->fBatchMode = 0;
  iVar1 = *(int *)&pAbc->Out;
  __ptr = pAbc->Err;
  if (iVar1 < 1) {
    if (__ptr != (FILE *)0x0) goto LAB_0035748e;
  }
  else {
    lVar3 = 8;
    lVar4 = 0;
    do {
      pvVar2 = *(void **)((long)&__ptr->_flags + lVar3);
      if (pvVar2 != (void *)0x0) {
        free(pvVar2);
        __ptr = pAbc->Err;
        *(undefined8 *)((long)&__ptr->_flags + lVar3) = 0;
        iVar1 = *(int *)&pAbc->Out;
      }
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x10;
    } while (lVar4 < iVar1);
LAB_0035748e:
    free(__ptr);
    pAbc->Err = (FILE *)0x0;
  }
  pAbc->Out = (FILE *)0x0;
  iVar1 = *(int *)&pAbc->Hst;
  pvVar2 = (void *)pAbc->TimeCommand;
  if (iVar1 < 1) {
    if (pvVar2 == (void *)0x0) goto LAB_00357503;
  }
  else {
    lVar3 = 8;
    lVar4 = 0;
    do {
      if (*(void **)((long)pvVar2 + lVar3) != (void *)0x0) {
        free(*(void **)((long)pvVar2 + lVar3));
        pvVar2 = (void *)pAbc->TimeCommand;
        *(undefined8 *)((long)pvVar2 + lVar3) = 0;
        iVar1 = *(int *)&pAbc->Hst;
      }
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x10;
    } while (lVar4 < iVar1);
  }
  free(pvVar2);
  pAbc->TimeCommand = 0.0;
LAB_00357503:
  pAbc->Hst = (FILE *)0x0;
  if (pAbc->vStore != (Vec_Ptr_t *)0x0) {
    free(pAbc->vStore);
    pAbc->vStore = (Vec_Ptr_t *)0x0;
  }
  pAbc->TimeTotal = 0.0;
  if (pAbc->sVersion != (char *)0x0) {
    free(pAbc->sVersion);
    pAbc->sVersion = (char *)0x0;
  }
  if (pAbc->sBinary != (char *)0x0) {
    free(pAbc->sBinary);
  }
  free(pAbc);
  return;
}

Assistant:

static inline void        Pla_AbcFreeMan( Abc_Frame_t * pAbc )                   { if ( pAbc->pAbcPla ) Pla_ManFree(Pla_AbcGetMan(pAbc));  }